

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O2

bool dxil_spv::emit_texture_store_instruction_dispatch
               (Impl *impl,CallInst *instruction,bool multi_sampled)

{
  CallInst *pCVar1;
  uint count;
  bool bVar2;
  Id IVar3;
  Builder *this;
  Value *pVVar4;
  CallInst *pCVar5;
  Operation *this_00;
  Type *type;
  undefined7 in_register_00000011;
  uint i_1;
  long lVar6;
  uint i;
  uint index;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  Id image_id;
  undefined4 local_74;
  mapped_type *local_70;
  Id coord [3];
  uint32_t local_50;
  uint num_coords_full;
  Id write_values [4];
  
  this = Converter::Impl::builder(impl);
  pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  IVar3 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
  image_id = IVar3;
  if (((impl->ags).num_instructions == 2) &&
     (pCVar1 = (impl->ags).backdoor_instructions[0],
     pCVar5 = (CallInst *)LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2),
     pCVar1 == pCVar5 && !multi_sampled)) {
    (impl->ags).active_uav_ptr = IVar3;
    (impl->ags).active_uav_op = TextureStore;
    return true;
  }
  local_74 = (undefined4)CONCAT71(in_register_00000011,multi_sampled);
  local_70 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&impl->handle_to_resource_meta,&image_id);
  coord[2] = 0;
  coord[0] = 0;
  coord[1] = 0;
  num_coords_full = 0;
  bVar2 = get_image_dimensions(impl,image_id,&num_coords_full,&local_50);
  count = num_coords_full;
  bVar9 = num_coords_full < 4;
  if (bVar9 && bVar2) {
    uVar8 = (ulong)num_coords_full;
    for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,(int)uVar7 + 2);
      IVar3 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
      coord[uVar7] = IVar3;
    }
    write_values[0] = 0;
    write_values[1] = 0;
    write_values[2] = 0;
    write_values[3] = 0;
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      index = (int)lVar6 + 5;
      pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,index);
      Converter::Impl::register_externally_visible_write(impl,pVVar4);
      pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,index);
      IVar3 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
      write_values[lVar6] = IVar3;
    }
    this_00 = Converter::Impl::allocate(impl,OpImageWrite);
    Operation::add_id(this_00,image_id);
    IVar3 = spv::Builder::makeUintType(this,0x20);
    IVar3 = Converter::Impl::build_vector(impl,IVar3,coord,count);
    Operation::add_id(this_00,IVar3);
    pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,5);
    type = LLVMBC::Value::getType(pVVar4);
    IVar3 = Converter::Impl::get_type_id(impl,type,0);
    IVar3 = Converter::Impl::build_vector(impl,IVar3,write_values,4);
    IVar3 = Converter::Impl::fixup_store_type_typed(impl,local_70->component_type,4,IVar3);
    Operation::add_id(this_00,IVar3);
    spv::Builder::addCapability(this,CapabilityStorageImageWriteWithoutFormat);
    if ((char)local_74 != '\0') {
      pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,10);
      IVar3 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
      Operation::add_literal(this_00,0x40);
      Operation::add_id(this_00,IVar3);
      spv::Builder::addCapability(this,CapabilityStorageImageMultisample);
    }
    Converter::Impl::add(impl,this_00,local_70->rov);
  }
  return bVar9 && bVar2;
}

Assistant:

bool emit_texture_store_instruction_dispatch(Converter::Impl &impl, const llvm::CallInst *instruction, bool multi_sampled)
{
	auto &builder = impl.builder();

	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));

	// Deferred 64-bit atomic. Resolve in a later AGS atomic.
	if (impl.ags.num_instructions == 2 &&
	    impl.ags.backdoor_instructions[0] == instruction->getOperand(2) && !multi_sampled)
	{
		impl.ags.active_uav_ptr = image_id;
		impl.ags.active_uav_op = DXIL::Op::TextureStore;
		return true;
	}

	const auto &meta = impl.handle_to_resource_meta[image_id];
	spv::Id coord[3] = {};

	unsigned num_coords_full = 0, num_coords = 0;
	if (!get_image_dimensions(impl, image_id, &num_coords_full, &num_coords))
		return false;

	// Cubes are not supported here.
	if (num_coords_full > 3)
		return false;

	for (unsigned i = 0; i < num_coords_full; i++)
		coord[i] = impl.get_id_for_value(instruction->getOperand(i + 2));

	spv::Id write_values[4] = {};
	for (unsigned i = 0; i < 4; i++)
	{
		impl.register_externally_visible_write(instruction->getOperand(i + 5));
		write_values[i] = impl.get_id_for_value(instruction->getOperand(i + 5));
	}

	// Ignore write mask. We cannot do anything meaningful about it.
	// The write mask must cover all components in the image, and there is no "sliced write" support for typed resources.

	Operation *op = impl.allocate(spv::OpImageWrite);

	op->add_id(image_id);
	op->add_id(impl.build_vector(builder.makeUintType(32), coord, num_coords_full));

	spv::Id store_id = impl.build_vector(impl.get_type_id(instruction->getOperand(5)->getType()), write_values, 4);
	store_id = impl.fixup_store_type_typed(meta.component_type, 4, store_id);
	op->add_id(store_id);
	builder.addCapability(spv::CapabilityStorageImageWriteWithoutFormat);

	if (multi_sampled)
	{
		spv::Id sample_id = impl.get_id_for_value(instruction->getOperand(10));
		op->add_literal(spv::ImageOperandsSampleMask);
		op->add_id(sample_id);
		builder.addCapability(spv::CapabilityStorageImageMultisample);
	}

	impl.add(op, meta.rov);
	return true;
}